

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlParseJson.c
# Opt level: O0

JL_STATUS ParseKeyName(ParseParameters *Params,_Bool IsBareWord)

{
  JL_STATUS JVar1;
  size_t local_20;
  size_t amountProcessed;
  JL_STATUS jlStatus;
  _Bool IsBareWord_local;
  ParseParameters *Params_local;
  
  local_20 = 0;
  amountProcessed._7_1_ = IsBareWord;
  _jlStatus = Params;
  JVar1 = ParseString(Params->JsonString + Params->StringIndex,
                      Params->JsonStringLength - Params->StringIndex,IsBareWord,false,&local_20,
                      &Params->Stack[Params->StackIndex].CurrentKeyName);
  if (JVar1 == JL_STATUS_SUCCESS) {
    _jlStatus->Stack[_jlStatus->StackIndex].CurrentKeyStringIndex = _jlStatus->StringIndex;
    _jlStatus->StringIndex = local_20 + _jlStatus->StringIndex;
  }
  return JVar1;
}

Assistant:

static
JL_STATUS
    ParseKeyName
    (
        ParseParameters*    Params,
        bool                IsBareWord
    )
{
    JL_STATUS jlStatus;
    size_t amountProcessed = 0;

    jlStatus = ParseString(
        Params->JsonString + Params->StringIndex,
        Params->JsonStringLength - Params->StringIndex,
        IsBareWord,
        false,
        &amountProcessed,
        &Params->Stack[Params->StackIndex].CurrentKeyName );
    if( JL_STATUS_SUCCESS == jlStatus )
    {
        Params->Stack[Params->StackIndex].CurrentKeyStringIndex = Params->StringIndex;
        Params->StringIndex += amountProcessed;
    }

    return jlStatus;
}